

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_move(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  ushort uVar1;
  uint uVar2;
  TCGv_i32 val;
  TCGv_i32 pTVar3;
  TCGv_i32 ea_result;
  int local_40;
  uint16_t dest_ea;
  int opsize;
  int op;
  TCGv_i32 dest;
  TCGv_i32 src;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = insn >> 0xc;
  if (uVar1 == 1) {
    local_40 = 0;
  }
  else if (uVar1 == 2) {
    local_40 = 2;
  }
  else {
    if (uVar1 != 3) {
      abort();
    }
    local_40 = 1;
  }
  val = gen_ea(env,s,insn,local_40,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
               (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (val == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    uVar2 = (int)(uint)insn >> 6 & 7;
    if (uVar2 == 1) {
      pTVar3 = get_areg(s,(int)(uint)insn >> 9 & 7);
      tcg_gen_mov_i32(tcg_ctx_00,pTVar3,val);
    }
    else {
      pTVar3 = gen_ea(env,s,(ushort)((int)(uint)insn >> 9) & 7 | (ushort)(uVar2 << 3),local_40,val,
                      (TCGv_i32 *)0x0,EA_STORE,
                      (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
      if (pTVar3 == tcg_ctx_00->NULL_QREG) {
        gen_addr_fault(s);
      }
      else {
        gen_logic_cc(s,val,local_40);
      }
    }
  }
  return;
}

Assistant:

DISAS_INSN(move)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv dest;
    int op;
    int opsize;

    switch (insn >> 12) {
    case 1: /* move.b */
        opsize = OS_BYTE;
        break;
    case 2: /* move.l */
        opsize = OS_LONG;
        break;
    case 3: /* move.w */
        opsize = OS_WORD;
        break;
    default:
        abort();
    }
    SRC_EA(env, src, opsize, 1, NULL);
    op = (insn >> 6) & 7;
    if (op == 1) {
        /* movea */
        /* The value will already have been sign extended.  */
        dest = AREG(insn, 9);
        tcg_gen_mov_i32(tcg_ctx, dest, src);
    } else {
        /* normal move */
        uint16_t dest_ea;
        dest_ea = ((insn >> 9) & 7) | (op << 3);
        DEST_EA(env, dest_ea, opsize, src, NULL);
        /* This will be correct because loads sign extend.  */
        gen_logic_cc(s, src, opsize);
    }
}